

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_gnu_longlink(archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed
                           )

{
  undefined1 local_50 [8];
  archive_string linkpath;
  wchar_t err;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_50 = (undefined1  [8])0x0;
  linkpath.s = (char *)0x0;
  linkpath.length = 0;
  linkpath.buffer_length._4_4_ = read_body_to_string(a,tar,(archive_string *)local_50,h,unconsumed);
  if (linkpath.buffer_length._4_4_ == L'\0') {
    archive_entry_set_link(entry,(char *)local_50);
  }
  archive_string_free((archive_string *)local_50);
  return linkpath.buffer_length._4_4_;
}

Assistant:

static int
header_gnu_longlink(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err;

	struct archive_string linkpath;
	archive_string_init(&linkpath);
	err = read_body_to_string(a, tar, &linkpath, h, unconsumed);
	if (err == ARCHIVE_OK) {
		archive_entry_set_link(entry, linkpath.s);
	}
	archive_string_free(&linkpath);
	return (err);
}